

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

void xmlRelaxNGFree(xmlRelaxNGPtr schema)

{
  xmlRelaxNGDocumentPtr pxVar1;
  xmlRelaxNGIncludePtr pxVar2;
  xmlRelaxNGDocumentPtr_conflict docu;
  xmlRelaxNGIncludePtr_conflict incl;
  xmlRelaxNGDefinePtr_conflict *ppxVar3;
  long lVar4;
  
  if (schema == (xmlRelaxNGPtr)0x0) {
    return;
  }
  if (schema->topgrammar != (xmlRelaxNGGrammarPtr_conflict)0x0) {
    xmlRelaxNGFreeGrammar(schema->topgrammar);
  }
  if (schema->doc != (xmlDocPtr)0x0) {
    xmlFreeDoc(schema->doc);
  }
  docu = schema->documents;
  while (docu != (xmlRelaxNGDocumentPtr_conflict)0x0) {
    pxVar1 = docu->next;
    xmlRelaxNGFreeDocument(docu);
    docu = pxVar1;
  }
  incl = schema->includes;
  while (incl != (xmlRelaxNGIncludePtr_conflict)0x0) {
    pxVar2 = incl->next;
    xmlRelaxNGFreeInclude(incl);
    incl = pxVar2;
  }
  ppxVar3 = schema->defTab;
  if (ppxVar3 != (xmlRelaxNGDefinePtr_conflict *)0x0) {
    if (0 < schema->defNr) {
      lVar4 = 0;
      do {
        xmlRelaxNGFreeDefine(schema->defTab[lVar4]);
        lVar4 = lVar4 + 1;
      } while (lVar4 < schema->defNr);
      ppxVar3 = schema->defTab;
    }
    (*xmlFree)(ppxVar3);
  }
  (*xmlFree)(schema);
  return;
}

Assistant:

void
xmlRelaxNGFree(xmlRelaxNGPtr schema)
{
    if (schema == NULL)
        return;

    if (schema->topgrammar != NULL)
        xmlRelaxNGFreeGrammar(schema->topgrammar);
    if (schema->doc != NULL)
        xmlFreeDoc(schema->doc);
    if (schema->documents != NULL)
        xmlRelaxNGFreeDocumentList(schema->documents);
    if (schema->includes != NULL)
        xmlRelaxNGFreeIncludeList(schema->includes);
    if (schema->defTab != NULL) {
        int i;

        for (i = 0; i < schema->defNr; i++)
            xmlRelaxNGFreeDefine(schema->defTab[i]);
        xmlFree(schema->defTab);
    }

    xmlFree(schema);
}